

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O0

void __thiscall VectorDouble::appendValue(VectorDouble *this,double l)

{
  long lVar1;
  void *pvVar2;
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  long addThis;
  ulong local_18;
  
  if (in_RDI[1] == in_RDI[2]) {
    local_18 = (ulong)in_RDI[2] >> 3;
    if ((long)local_18 < vDefaultBoost) {
      local_18 = vDefaultBoost;
    }
    in_RDI[2] = local_18 + in_RDI[2];
    pvVar2 = realloc((void *)*in_RDI,in_RDI[2] << 3);
    *in_RDI = (long)pvVar2;
  }
  lVar1 = in_RDI[1];
  in_RDI[1] = lVar1 + 1;
  *(undefined8 *)(*in_RDI + lVar1 * 8) = in_XMM0_Qa;
  return;
}

Assistant:

void VectorDouble::appendValue(const double l) {
  long addThis;
  if (vLength == vaLength) {
    addThis = vaLength / 8;
    if (VectorDouble::vDefaultBoost > addThis)
      addThis = VectorDouble::vDefaultBoost;
    vaLength += addThis;
    vData = (double *)realloc(vData, sizeof(double) * vaLength);
  }
  vData[vLength++] = l;
}